

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O1

PatternView * ZXing::QRCode::FindPattern(PatternView *__return_storage_ptr__,PatternView *view)

{
  int iVar1;
  Iterator puVar2;
  double dVar3;
  ushort uVar4;
  PatternView local_40;
  
  if (4 < view->_size) {
    local_40._data = view->_data;
    local_40._base = view->_base;
    local_40._end = view->_end;
    local_40._size = 5;
    if (local_40._data == local_40._base + 1) {
      uVar4 = local_40._data[4];
      if (local_40._data[4] < *local_40._data) {
        uVar4 = *local_40._data;
      }
      if ((uint)uVar4 * 2 <= (uint)local_40._data[2]) {
        uVar4 = local_40._data[3];
        if (local_40._data[3] < local_40._data[1]) {
          uVar4 = local_40._data[1];
        }
        if (uVar4 <= local_40._data[2]) {
          dVar3 = IsPattern<true,5,7>(&local_40,(FixedPattern<5,_7,_false> *)PATTERN,0x7fffffff,0.1,
                                      0.0);
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
LAB_00185198:
            __return_storage_ptr__->_base = local_40._base;
            __return_storage_ptr__->_end = local_40._end;
            goto LAB_00185255;
          }
        }
      }
    }
    puVar2 = view->_data;
    iVar1 = view->_size;
    if (local_40._data < puVar2 + (long)iVar1 + -5) {
      do {
        uVar4 = local_40._data[4];
        if (local_40._data[4] < *local_40._data) {
          uVar4 = *local_40._data;
        }
        if ((uint)uVar4 * 2 <= (uint)local_40._data[2]) {
          uVar4 = local_40._data[3];
          if (local_40._data[3] < local_40._data[1]) {
            uVar4 = local_40._data[1];
          }
          if (uVar4 <= local_40._data[2]) {
            dVar3 = IsPattern<true,5,7>(&local_40,(FixedPattern<5,_7,_false> *)PATTERN,
                                        (uint)local_40._data[-1],0.1,0.0);
            if ((dVar3 != 0.0) || (NAN(dVar3))) goto LAB_00185198;
          }
        }
        if (local_40._data != (ushort *)0x0) {
          local_40._data = local_40._data + 2;
        }
      } while (local_40._data < puVar2 + (long)iVar1 + -5);
    }
  }
  local_40._data._0_4_ = 0;
  local_40._data._4_4_ = 0;
  local_40._size = 0;
  local_40._12_4_ = 0;
  __return_storage_ptr__->_base = (Iterator)0x0;
  __return_storage_ptr__->_end = (Iterator)0x0;
LAB_00185255:
  *(undefined4 *)&__return_storage_ptr__->_data = local_40._data._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->_data + 4) = local_40._data._4_4_;
  __return_storage_ptr__->_size = local_40._size;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_40._12_4_;
  return __return_storage_ptr__;
}

Assistant:

PatternView FindPattern(const PatternView& view)
{
	return FindLeftGuard<PATTERN.size()>(view, PATTERN.size(), [](const PatternView& view, int spaceInPixel) {
		// perform a fast plausability test for 1:1:3:1:1 pattern
		if (view[2] < 2 * std::max(view[0], view[4]) || view[2] < std::max(view[1], view[3]))
			return 0.;
		return IsPattern<E2E>(view, PATTERN, spaceInPixel, 0.1); // the requires 4, here we accept almost 0
	});
}